

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void checkrepeated(FuncState *fs,Labellist *ll,TString *label)

{
  char *msg_00;
  char *msg;
  int i;
  TString *label_local;
  Labellist *ll_local;
  FuncState *fs_local;
  
  msg._4_4_ = fs->bl->firstlabel;
  while( true ) {
    if (ll->n <= msg._4_4_) {
      return;
    }
    if (label == ll->arr[msg._4_4_].name) break;
    msg._4_4_ = msg._4_4_ + 1;
  }
  msg_00 = luaO_pushfstring(fs->ls->L,"label \'%s\' already defined on line %d",label + 1,
                            (ulong)(uint)ll->arr[msg._4_4_].line);
  semerror(fs->ls,msg_00);
}

Assistant:

static void checkrepeated (FuncState *fs, Labellist *ll, TString *label) {
  int i;
  for (i = fs->bl->firstlabel; i < ll->n; i++) {
    if (eqstr(label, ll->arr[i].name)) {
      const char *msg = luaO_pushfstring(fs->ls->L,
                          "label '%s' already defined on line %d",
                          getstr(label), ll->arr[i].line);
      semerror(fs->ls, msg);
    }
  }
}